

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O3

Result __thiscall wabt::TypeChecker::OnBrOnExn(TypeChecker *this,Index depth,TypeVector *types)

{
  _Alloc_hider _Var1;
  Result RVar2;
  Result RVar3;
  Enum EVar4;
  TypeVector *prefix;
  TypeChecker *this_00;
  _anonymous_namespace_ *this_01;
  Label *label;
  Label *local_70;
  string local_68;
  string local_48;
  
  RVar2 = PopAndCheck1Type(this,(Type)0xffffffe8,"br_on_exn");
  this_00 = this;
  RVar3 = GetLabel(this,depth,&local_70);
  EVar4 = Error;
  if (RVar3.enum_ != Error) {
    prefix = &local_70->param_types;
    this_01 = (_anonymous_namespace_ *)&local_70->result_types;
    if (local_70->label_type == Loop) {
      this_01 = (_anonymous_namespace_ *)prefix;
    }
    RVar3 = CheckTypes(this_00,types,(TypeVector *)this_01);
    if (RVar3.enum_ == Error) {
      (anonymous_namespace)::TypesToString_abi_cxx11_
                (&local_48,this_01,(TypeVector *)0x0,(char *)prefix);
      _Var1._M_p = local_48._M_dataplus._M_p;
      (anonymous_namespace)::TypesToString_abi_cxx11_
                (&local_68,(_anonymous_namespace_ *)types,(TypeVector *)0x0,(char *)prefix);
      PrintError(this,"br_on_exn has inconsistent types: expected %s, got %s",_Var1._M_p,
                 local_68._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p);
      }
      RVar2.enum_ = Error;
    }
    PushType(this,(Type)0xffffffe8);
    EVar4 = RVar2.enum_;
  }
  return (Result)EVar4;
}

Assistant:

Result TypeChecker::OnBrOnExn(Index depth, const TypeVector& types) {
  Result result = PopAndCheck1Type(Type::Exnref, "br_on_exn");
  Label* label;
  CHECK_RESULT(GetLabel(depth, &label));
  if (Failed(CheckTypes(types, label->br_types()))) {
    PrintError("br_on_exn has inconsistent types: expected %s, got %s",
               TypesToString(label->br_types()).c_str(),
               TypesToString(types).c_str());
    result = Result::Error;
  }
  PushType(Type::Exnref);
  return result;
}